

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O1

nh_bool find_role(nh_roles_info *ri,char *role_str,int *out_role)

{
  int iVar1;
  char **ppcVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = ri->num_roles;
  if (0 < (long)iVar1) {
    ppcVar2 = ri->rolenames_m;
    lVar4 = 0;
    do {
      iVar3 = strcmp(role_str,ppcVar2[lVar4]);
      if ((iVar3 == 0) ||
         ((ri->rolenames_f[lVar4] != (char *)0x0 &&
          (iVar3 = strcmp(role_str,ri->rolenames_f[lVar4]), iVar3 == 0)))) {
        *out_role = (int)lVar4;
        return '\x01';
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return '\0';
}

Assistant:

static nh_bool find_role(const struct nh_roles_info *ri,
			 const char *role_str, int *out_role)
{
    int i;

    for (i = 0; i < ri->num_roles; i++) {
	if (!strcmp(role_str, ri->rolenames_m[i]) ||
	    (ri->rolenames_f[i] && !strcmp(role_str, ri->rolenames_f[i]))) {
	    *out_role = i;
	    return TRUE;
	}
    }
    return FALSE;
}